

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O0

void flow::dumpArrays<long>
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *vv,char *name)

{
  bool bVar1;
  ostream *poVar2;
  const_reference args;
  string_view local_78;
  string local_68;
  size_type local_48;
  size_t m;
  size_t k;
  const_reference local_30;
  value_type *array;
  size_t e;
  size_t i;
  char *name_local;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *vv_local;
  
  i = (size_t)name;
  name_local = (char *)vv;
  bVar1 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::empty(vv);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n; Constant ");
    poVar2 = std::operator<<(poVar2,(char *)i);
    std::operator<<(poVar2," Arrays\n");
    e = 0;
    array = (value_type *)
            std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::size((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)name_local);
    for (; (value_type *)e != array; e = e + 1) {
      local_30 = std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               *)name_local,e);
      poVar2 = std::operator<<((ostream *)&std::cout,".const array<");
      poVar2 = std::operator<<(poVar2,(char *)i);
      poVar2 = std::operator<<(poVar2,"> ");
      k._4_4_ = std::setw(3);
      poVar2 = std::operator<<(poVar2,k._4_4_);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,e);
      std::operator<<(poVar2," = [");
      m = 0;
      local_48 = std::vector<long,_std::allocator<long>_>::size(local_30);
      for (; m != local_48; m = m + 1) {
        if (m != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        fmt::v5::basic_string_view<char>::basic_string_view(&local_78,"{}");
        args = std::vector<long,_std::allocator<long>_>::operator[](local_30,m);
        fmt::v5::format<long>(&local_68,local_78,args);
        std::operator<<((ostream *)&std::cout,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
      std::operator<<((ostream *)&std::cout,"];\n");
    }
  }
  return;
}

Assistant:

void dumpArrays(const std::vector<std::vector<T>>& vv, const char* name) {
  if (vv.empty()) return;

  std::cout << "\n; Constant " << name << " Arrays\n";
  for (size_t i = 0, e = vv.size(); i != e; ++i) {
    const auto& array = vv[i];
    std::cout << ".const array<" << name << "> " << std::setw(3) << i << " = [";
    for (size_t k = 0, m = array.size(); k != m; ++k) {
      if (k) std::cout << ", ";
      std::cout << fmt::format("{}", array[k]);
    }
    std::cout << "];\n";
  }
}